

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

void rw::d3d9::writeNativeTexture(Texture *tex,Stream *stream)

{
  Raster *this;
  int iVar1;
  uint32 uVar2;
  int32 iVar3;
  uint val;
  uint8 *puVar4;
  int local_4c;
  int32 i;
  uint8 *data;
  byte local_35;
  uint32 size;
  uint8 flags;
  int32 numLevels;
  D3dRaster *ext;
  Raster *raster;
  int32 chunksize;
  Stream *stream_local;
  Texture *tex_local;
  
  uVar2 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar2 - 0xc);
  Stream::writeU32(stream,9);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  iVar1 = d3d::nativeRasterOffset;
  this = tex->raster;
  iVar3 = Raster::getNumLevels(this);
  Stream::writeI32(stream,this->format);
  Stream::writeU32(stream,*(uint32 *)((long)&this->height + (long)iVar1));
  Stream::writeU16(stream,(uint16)this->width);
  Stream::writeU16(stream,(uint16)this->height);
  Stream::writeU8(stream,(uint8)this->depth);
  Stream::writeU8(stream,(uint8)iVar3);
  Stream::writeU8(stream,(uint8)this->type);
  local_35 = (*(byte *)((long)&this->stride + (long)iVar1) & 1) != 0;
  if ((*(byte *)((long)&this->stride + (long)iVar1 + 2) & 1) != 0) {
    local_35 = local_35 | 4;
  }
  if ((*(byte *)((long)&this->stride + (long)iVar1 + 1) & 1) != 0) {
    local_35 = local_35 | 8;
  }
  Stream::writeU8(stream,local_35);
  if ((this->format & 0x4000U) == 0) {
    if ((this->format & 0x2000U) != 0) {
      (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + (long)iVar1),0x400);
    }
  }
  else {
    (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + (long)iVar1),0x80);
  }
  for (local_4c = 0; local_4c < iVar3; local_4c = local_4c + 1) {
    val = d3d::getLevelSize(this,local_4c);
    Stream::writeU32(stream,val);
    puVar4 = Raster::lock(this,local_4c,2);
    (*stream->_vptr_Stream[3])(stream,puVar4,(ulong)val);
    Raster::unlock(this,local_4c);
  }
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_D3D9);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	Raster *raster = tex->raster;
	D3dRaster *ext = GETD3DRASTEREXT(raster);
	int32 numLevels = raster->getNumLevels();
	stream->writeI32(raster->format);
	stream->writeU32(ext->format);
	stream->writeU16(raster->width);
	stream->writeU16(raster->height);
	stream->writeU8(raster->depth);
	stream->writeU8(numLevels);
	stream->writeU8(raster->type);
	uint8 flags = 0;
	if(ext->hasAlpha)
		flags |= 1;
	// no cube supported yet
	if(ext->autogenMipmap)
		flags |= 4;
	if(ext->customFormat)
		flags |= 8;
	stream->writeU8(flags);

	if(raster->format & Raster::PAL4)
		stream->write8(ext->palette, 4*32);
	else if(raster->format & Raster::PAL8)
		stream->write8(ext->palette, 4*256);

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = getLevelSize(raster, i);
		stream->writeU32(size);
		data = raster->lock(i, Raster::LOCKREAD);
		stream->write8(data, size);
		raster->unlock(i);
	}
}